

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.h
# Opt level: O0

void tcmalloc::ThreadCache::set_min_per_thread_cache_size(size_t new_size)

{
  size_t new_size_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  min_per_thread_cache_size_ = new_size;
  return;
}

Assistant:

static void set_min_per_thread_cache_size(size_t new_size) {
    min_per_thread_cache_size_.store(new_size, std::memory_order_relaxed);
  }